

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  string_view sVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  Result RVar8;
  Result RVar9;
  Result RVar10;
  wabt *this;
  size_type __pos;
  size_t sVar11;
  FileStream *callback;
  char *extraout_RDX;
  uint uVar12;
  Module *this_00;
  size_t sVar13;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view sVar14;
  string_view sVar15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  allocator<char> local_4d9;
  ValidateOptions options_1;
  undefined6 uStack_4c6;
  FileStream h_stream;
  string_view header_name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  Stream *local_408 [4];
  string header_name_full;
  ReadBinaryOptions options;
  OptionParser parser;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  stack0xfffffffffffffb38 =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:71:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&options_1);
  if (stack0xfffffffffffffb38 != (_Manager_type)0x0) {
    (*stack0xfffffffffffffb38)(&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  stack0xfffffffffffffb38 =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:78:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",
             (Callback *)&options_1);
  if (stack0xfffffffffffffb38 != (_Manager_type)0x0) {
    (*stack0xfffffffffffffb38)(&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  stack0xfffffffffffffb38 =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:88:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'n',"module-name","MODNAME",
             "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
             ,(Callback *)&options_1);
  if (stack0xfffffffffffffb38 != (_Manager_type)0x0) {
    (*stack0xfffffffffffffb38)(&options_1,&options_1,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  stack0xfffffffffffffb38 =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:91:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&options_1);
  if (stack0xfffffffffffffb38 != (_Manager_type)0x0) {
    (*stack0xfffffffffffffb38)(&options_1,&options_1,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options_1,"filename",(allocator<char> *)&options);
  callback = &h_stream;
  h_stream.super_Stream._vptr_Stream = (_func_int **)0x0;
  h_stream.super_Stream.offset_ = 0;
  h_stream.super_Stream.log_stream_ =
       (Stream *)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
       ::_M_invoke;
  h_stream.super_Stream._16_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
       ::_M_manager;
  bVar6 = false;
  wabt::OptionParser::AddArgument(&parser,(string *)&options_1,One,(Callback *)callback);
  if (h_stream.super_Stream._16_8_ != 0) {
    (*(code *)h_stream.super_Stream._16_8_)(&h_stream,&h_stream,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  if (s_features.exceptions_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"exceptions",(allocator<char> *)&h_stream);
    bVar6 = IsFeatureSupported((string *)&options_1);
    bVar6 = !bVar6;
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.mutable_globals_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"mutable-globals",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.sat_float_to_int_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"saturating-float-to-int",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.sign_extension_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"sign-extension",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.simd_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"simd",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.threads_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"threads",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.function_references_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"function-references",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(!bVar7 | bVar6);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.multi_value_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"multi-value",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.tail_call_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"tail-call",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.bulk_memory_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"bulk-memory",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.reference_types_enabled_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"reference-types",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.annotations_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"annotations",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.code_metadata_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"code-metadata",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.gc_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"gc",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.memory64_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"memory64",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.multi_memory_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"multi-memory",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.extended_const_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"extended-const",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    bVar6 = (bool)(bVar6 | !bVar7);
    std::__cxx11::string::_M_dispose();
  }
  if (s_features.relaxed_simd_enabled_ != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&options_1,"relaxed-simd",(allocator<char> *)&h_stream);
    bVar7 = IsFeatureSupported((string *)&options_1);
    std::__cxx11::string::_M_dispose();
    if (!bVar7) goto LAB_00113dc2;
  }
  if (!bVar6) {
    wabt::OptionParser::~OptionParser(&parser);
    _Var2._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
    sVar14._M_str = (char *)&file_data;
    sVar14._M_len = (size_t)_Var2._M_p;
    RVar8 = wabt::ReadFile(this,sVar14,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    if (RVar8.enum_ == Ok) {
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (Module *)&parser;
      wabt::Module::Module(this_00);
      options.read_debug_names = (bool)(s_read_debug_names ^ 1);
      options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      options.features.simd_enabled_ = s_features.simd_enabled_;
      options.features.threads_enabled_ = s_features.threads_enabled_;
      options.features.function_references_enabled_ = s_features.function_references_enabled_;
      options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      options.features.annotations_enabled_ = s_features.annotations_enabled_;
      options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
      options.features.gc_enabled_ = s_features.gc_enabled_;
      options.features.memory64_enabled_ = s_features.memory64_enabled_;
      options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
      options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
      options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
      options.log_stream =
           (Stream *)
           s_log_stream._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      options.stop_on_first_error = true;
      options.fail_on_custom_section_error = true;
      options.skip_function_bodies = false;
      RVar8 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                                 file_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&options,&errors,
                                 this_00);
      if (RVar8.enum_ == Ok) {
        options_1.features.extended_const_enabled_ = s_features.extended_const_enabled_;
        options_1.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
        options_1.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
        options_1.features.exceptions_enabled_ = s_features.exceptions_enabled_;
        options_1.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
        options_1.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
        options_1.features.simd_enabled_ = s_features.simd_enabled_;
        options_1.features.threads_enabled_ = s_features.threads_enabled_;
        options_1.features.function_references_enabled_ = s_features.function_references_enabled_;
        options_1.features.multi_value_enabled_ = s_features.multi_value_enabled_;
        options_1.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
        options_1.features.tail_call_enabled_ = s_features.tail_call_enabled_;
        options_1.features.reference_types_enabled_ = s_features.reference_types_enabled_;
        options_1.features.annotations_enabled_ = s_features.annotations_enabled_;
        options_1.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
        options_1.features.gc_enabled_ = s_features.gc_enabled_;
        options_1.features.memory64_enabled_ = s_features.memory64_enabled_;
        options_1.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
        RVar9 = wabt::ValidateModule((Module *)&parser,&errors,&options_1);
        RVar10 = wabt::GenerateNames((Module *)&parser,None);
        sVar1._M_str = s_write_c_options.module_name._M_str;
        sVar1._M_len = s_write_c_options.module_name._M_len;
        RVar8.enum_ = Error;
        if ((RVar9.enum_ != Error) && (s_write_c_options.module_name = sVar1, RVar10.enum_ != Error)
           ) {
          wabt::ApplyNames((Module *)&parser);
          if (s_outfile_abi_cxx11_._M_string_length == 0) {
            wabt::FileStream::FileStream((FileStream *)&options_1,_stdout,(Stream *)0x0);
            RVar8 = wabt::WriteC((wabt *)&options_1,(Stream *)&options_1,(Stream *)"wasm.h",
                                 (char *)&parser,(Module *)&s_write_c_options,
                                 (WriteCOptions *)this_00);
            wabt::FileStream::~FileStream((FileStream *)&options_1);
          }
          else {
            options_1.features.exceptions_enabled_ =
                 (bool)(undefined1)s_outfile_abi_cxx11_._M_string_length;
            options_1.features.mutable_globals_enabled_ =
                 (bool)s_outfile_abi_cxx11_._M_string_length._1_1_;
            options_1.features.sat_float_to_int_enabled_ =
                 (bool)s_outfile_abi_cxx11_._M_string_length._2_1_;
            options_1.features.sign_extension_enabled_ =
                 (bool)s_outfile_abi_cxx11_._M_string_length._3_1_;
            options_1.features.simd_enabled_ = (bool)s_outfile_abi_cxx11_._M_string_length._4_1_;
            options_1.features.threads_enabled_ = (bool)s_outfile_abi_cxx11_._M_string_length._5_1_;
            options_1.features.function_references_enabled_ =
                 (bool)s_outfile_abi_cxx11_._M_string_length._6_1_;
            options_1.features.multi_value_enabled_ =
                 (bool)s_outfile_abi_cxx11_._M_string_length._7_1_;
            options_1.features._8_8_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
            __pos = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                              ((basic_string_view<char,_std::char_traits<char>_> *)&options_1,'.',
                               0xffffffffffffffff);
            __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&options_1,__pos,
                             0xffffffffffffffff);
            uVar4 = options_1.features._8_8_;
            uVar3 = options_1.features._0_8_;
            __y._M_str = ".c";
            __y._M_len = 2;
            bVar6 = std::operator==(__x,__y);
            uVar5 = options_1.features._8_8_;
            sVar13 = __x._M_len;
            if (!bVar6) {
              sVar13 = 0;
            }
            h_stream.super_Stream._vptr_Stream = (_func_int **)(uVar3 - sVar13);
            options_1.features.tail_call_enabled_ = SUB81(uVar4,0);
            options_1.features.bulk_memory_enabled_ = SUB81(uVar4,1);
            options_1.features.reference_types_enabled_ = SUB81(uVar4,2);
            options_1.features.annotations_enabled_ = SUB81(uVar4,3);
            options_1.features.code_metadata_enabled_ = SUB81(uVar4,4);
            options_1.features.gc_enabled_ = SUB81(uVar4,5);
            options_1.features.memory64_enabled_ = SUB81(uVar4,6);
            options_1.features.multi_memory_enabled_ = SUB81(uVar4,7);
            h_stream.super_Stream.offset_._0_1_ = options_1.features.tail_call_enabled_;
            h_stream.super_Stream.offset_._1_1_ = options_1.features.bulk_memory_enabled_;
            h_stream.super_Stream.offset_._2_1_ = options_1.features.reference_types_enabled_;
            h_stream.super_Stream.offset_._3_1_ = options_1.features.annotations_enabled_;
            h_stream.super_Stream.offset_._4_1_ = options_1.features.code_metadata_enabled_;
            h_stream.super_Stream.offset_._5_1_ = options_1.features.gc_enabled_;
            h_stream.super_Stream.offset_._6_1_ = options_1.features.memory64_enabled_;
            h_stream.super_Stream.offset_._7_1_ = options_1.features.multi_memory_enabled_;
            options_1.features._8_8_ = uVar5;
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&options_1,
                       (basic_string_view<char,_std::char_traits<char>_> *)&h_stream,
                       (allocator<char> *)local_408);
            std::operator+(&header_name_full,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &options_1,".h");
            std::__cxx11::string::_M_dispose();
            _Var2 = s_outfile_abi_cxx11_._M_dataplus;
            sVar11 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
            filename._M_str = _Var2._M_p;
            filename._M_len = sVar11;
            wabt::FileStream::FileStream((FileStream *)&options_1,filename,(Stream *)0x0);
            filename_00._M_str = header_name_full._M_dataplus._M_p;
            filename_00._M_len = header_name_full._M_string_length;
            wabt::FileStream::FileStream(&h_stream,filename_00,(Stream *)0x0);
            filename_01._M_str = extraout_RDX;
            filename_01._M_len = (size_t)header_name_full._M_dataplus._M_p;
            header_name = wabt::GetBasename((wabt *)header_name_full._M_string_length,filename_01);
            sVar15._M_str = s_write_c_options.module_name._M_str;
            sVar15._M_len = s_write_c_options.module_name._M_len;
            filename_02._M_str = header_name._M_str;
            if (s_write_c_options.module_name._M_len == 0) {
              s_write_c_options.module_name._M_len = parser.description_._M_string_length;
              s_write_c_options.module_name._M_str = parser.description_._M_dataplus._M_p;
              sVar15._M_str = parser.description_._M_dataplus._M_p;
              sVar15._M_len = parser.description_._M_string_length;
              if (parser.description_._M_string_length == 0) {
                filename_02._M_len = (size_t)s_infile_abi_cxx11_._M_dataplus._M_p;
                sVar14 = wabt::GetBasename((wabt *)s_infile_abi_cxx11_._M_string_length,filename_02)
                ;
                filename_03._M_str = sVar14._M_str;
                filename_03._M_len = (size_t)filename_03._M_str;
                sVar15 = wabt::StripExtension((wabt *)sVar14._M_len,filename_03);
              }
            }
            s_write_c_options.module_name = sVar15;
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)local_408,&header_name,&local_4d9);
            RVar8 = wabt::WriteC((wabt *)&options_1,&h_stream.super_Stream,local_408[0],
                                 (char *)&parser,(Module *)&s_write_c_options,
                                 (WriteCOptions *)this_00);
            std::__cxx11::string::_M_dispose();
            wabt::FileStream::~FileStream(&h_stream);
            wabt::FileStream::~FileStream((FileStream *)&options_1);
            std::__cxx11::string::_M_dispose();
          }
        }
      }
      options_1.features._0_8_ = &options_1.features.extended_const_enabled_;
      options_1.features.tail_call_enabled_ = false;
      options_1.features.bulk_memory_enabled_ = false;
      options_1.features.reference_types_enabled_ = false;
      options_1.features.annotations_enabled_ = false;
      options_1.features.code_metadata_enabled_ = false;
      options_1.features.gc_enabled_ = false;
      options_1.features.memory64_enabled_ = false;
      options_1.features.multi_memory_enabled_ = false;
      stack0xfffffffffffffb38 = (code *)((ulong)stack0xfffffffffffffb38 & 0xffffffffffffff00);
      wabt::FormatErrorsToFile
                (&errors,Binary,(LexerSourceLineFinder *)0x0,(FILE *)_stderr,(string *)&options_1,
                 Never,0x50);
      std::__cxx11::string::_M_dispose();
      wabt::Module::~Module((Module *)&parser);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
      uVar12 = (uint)(RVar8.enum_ != Ok);
    }
    else {
      uVar12 = 1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return uVar12;
  }
LAB_00113dc2:
  fwrite("wasm2c currently only supports a limited set of features.\n",0x3a,1,_stderr);
  exit(1);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name_full =
              std::string(strip_extension(s_outfile)) + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name_full);
          std::string_view header_name = GetBasename(header_name_full);
          if (s_write_c_options.module_name.empty()) {
            s_write_c_options.module_name = module.name;
            if (s_write_c_options.module_name.empty()) {
              // In the absence of module name in the names section use the
              // filename.
              s_write_c_options.module_name =
                  StripExtension(GetBasename(s_infile));
            }
          }
          result =
              WriteC(&c_stream, &h_stream, std::string(header_name).c_str(),
                     &module, s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}